

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptSelectionStatement
          (HlslGrammar *this,TIntermNode **statement,TAttributes *attributes)

{
  HlslParseContext *this_00;
  TIntermNodePair nodePair;
  bool bVar1;
  int iVar2;
  TIntermSelection *pTVar3;
  undefined4 extraout_var;
  TIntermNode *local_58;
  TIntermNodePair thenElse;
  TIntermTyped *condition;
  TSourceLoc loc;
  TAttributes *attributes_local;
  TIntermNode **statement_local;
  HlslGrammar *this_local;
  
  condition = (TIntermTyped *)(this->super_HlslTokenStream).token.loc.name;
  loc.name = *(TString **)&(this->super_HlslTokenStream).token.loc.string;
  loc.string = (this->super_HlslTokenStream).token.loc.column;
  loc.line = *(int *)&(this->super_HlslTokenStream).token.loc.field_0x14;
  loc._16_8_ = attributes;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokIf);
  if (bVar1) {
    HlslParseContext::pushScope(this->parseContext);
    bVar1 = acceptParenExpression(this,(TIntermTyped **)&thenElse.node2);
    if (bVar1) {
      thenElse.node2 =
           &HlslParseContext::convertConditionalExpression
                      (this->parseContext,(TSourceLoc *)&condition,(TIntermTyped *)thenElse.node2,
                       true)->super_TIntermNode;
      if ((TIntermTyped *)thenElse.node2 == (TIntermTyped *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        memset(&local_58,0,0x10);
        (this->parseContext->super_TParseContextBase).controlFlowNestingLevel =
             (this->parseContext->super_TParseContextBase).controlFlowNestingLevel + 1;
        bVar1 = acceptScopedStatement(this,&local_58);
        if (bVar1) {
          bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokElse);
          if ((!bVar1) || (bVar1 = acceptScopedStatement(this,&thenElse.node1), bVar1)) {
            nodePair.node2 = thenElse.node1;
            nodePair.node1 = local_58;
            pTVar3 = TIntermediate::addSelection
                               (this->intermediate,(TIntermTyped *)thenElse.node2,nodePair,
                                (TSourceLoc *)&condition);
            *statement = (TIntermNode *)pTVar3;
            this_00 = this->parseContext;
            iVar2 = (*(*statement)->_vptr_TIntermNode[9])();
            HlslParseContext::handleSelectionAttributes
                      (this_00,(TSourceLoc *)&condition,
                       (TIntermSelection *)CONCAT44(extraout_var,iVar2),(TAttributes *)loc._16_8_);
            HlslParseContext::popScope(this->parseContext);
            (this->parseContext->super_TParseContextBase).controlFlowNestingLevel =
                 (this->parseContext->super_TParseContextBase).controlFlowNestingLevel + -1;
            this_local._7_1_ = true;
          }
          else {
            expected(this,"else statement");
            this_local._7_1_ = false;
          }
        }
        else {
          expected(this,"then statement");
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptSelectionStatement(TIntermNode*& statement, const TAttributes& attributes)
{
    TSourceLoc loc = token.loc;

    // IF
    if (! acceptTokenClass(EHTokIf))
        return false;

    // so that something declared in the condition is scoped to the lifetimes
    // of the then-else statements
    parseContext.pushScope();

    // LEFT_PAREN expression RIGHT_PAREN
    TIntermTyped* condition;
    if (! acceptParenExpression(condition))
        return false;
    condition = parseContext.convertConditionalExpression(loc, condition);
    if (condition == nullptr)
        return false;

    // create the child statements
    TIntermNodePair thenElse = { nullptr, nullptr };

    ++parseContext.controlFlowNestingLevel;  // this only needs to work right if no errors

    // then statement
    if (! acceptScopedStatement(thenElse.node1)) {
        expected("then statement");
        return false;
    }

    // ELSE
    if (acceptTokenClass(EHTokElse)) {
        // else statement
        if (! acceptScopedStatement(thenElse.node2)) {
            expected("else statement");
            return false;
        }
    }

    // Put the pieces together
    statement = intermediate.addSelection(condition, thenElse, loc);
    parseContext.handleSelectionAttributes(loc, statement->getAsSelectionNode(), attributes);

    parseContext.popScope();
    --parseContext.controlFlowNestingLevel;

    return true;
}